

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t Bcj2_Decode(_7zip *zip,uint8_t *outBuf,size_t outSize)

{
  size_t *psVar1;
  long lVar2;
  byte bVar3;
  uchar uVar4;
  ushort uVar5;
  uint uVar6;
  uchar *puVar7;
  size_t sVar8;
  uchar *puVar9;
  size_t sVar10;
  uchar *puVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  int iVar15;
  uint *puVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  size_t sVar20;
  uint16_t *puVar21;
  uint uVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint8_t out [4];
  uint8_t local_84 [4];
  size_t local_80;
  byte *local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  ulong local_58;
  ulong local_50;
  byte *local_48;
  uchar *local_40;
  uint16_t *local_38;
  
  sVar24 = zip->tmp_stream_bytes_remaining;
  puVar7 = zip->tmp_stream_buff;
  sVar8 = zip->tmp_stream_bytes_avail;
  local_50 = zip->sub_stream_bytes_remaining[0];
  puVar9 = zip->sub_stream_buff[0];
  sVar10 = zip->sub_stream_size[0];
  puVar11 = zip->sub_stream_buff[1];
  local_58 = zip->sub_stream_bytes_remaining[1];
  sVar12 = zip->sub_stream_bytes_remaining[2];
  local_48 = zip->sub_stream_buff[2] + zip->sub_stream_size[2];
  local_78 = local_48 + -sVar12;
  sVar13 = zip->sub_stream_size[1];
  if (zip->bcj_state == 0) {
    zip->bcj2_prevByte = '\0';
    auVar14 = _DAT_00165390;
    lVar19 = 0;
    auVar28 = _DAT_00167600;
    auVar29 = _DAT_00167610;
    auVar30 = _DAT_00167620;
    auVar31 = _DAT_00165380;
    do {
      auVar32 = auVar31 ^ auVar14;
      iVar15 = auVar32._0_4_;
      iVar37 = auVar32._8_4_;
      auVar38._4_4_ = iVar15;
      auVar38._0_4_ = iVar15;
      auVar38._8_4_ = iVar37;
      auVar38._12_4_ = iVar37;
      auVar42._0_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar42._4_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar42._8_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar42._12_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar33._0_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar33._4_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar33._8_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar33._12_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar33 = auVar33 & auVar42;
      auVar32 = pshuflw(auVar38,auVar33,0xe8);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19] = 0x400;
      }
      auVar32 = packssdw(auVar33,auVar33);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
        zip->bcj2_p[lVar19 + 1] = 0x400;
      }
      auVar32 = auVar30 ^ auVar14;
      iVar15 = auVar32._0_4_;
      iVar37 = auVar32._8_4_;
      auVar39._4_4_ = iVar15;
      auVar39._0_4_ = iVar15;
      auVar39._8_4_ = iVar37;
      auVar39._12_4_ = iVar37;
      auVar43._0_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar43._4_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar43._8_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar43._12_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar34._0_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar34._4_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar34._8_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar34._12_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar34 = auVar34 & auVar43;
      auVar32 = packssdw(auVar39,auVar34);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19 + 2] = 0x400;
      }
      auVar32 = pshufhw(auVar34,auVar34,0x84);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19 + 3] = 0x400;
      }
      auVar32 = auVar29 ^ auVar14;
      iVar15 = auVar32._0_4_;
      iVar37 = auVar32._8_4_;
      auVar40._4_4_ = iVar15;
      auVar40._0_4_ = iVar15;
      auVar40._8_4_ = iVar37;
      auVar40._12_4_ = iVar37;
      auVar44._0_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar44._4_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar44._8_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar44._12_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar35._0_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar35._4_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar35._8_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar35._12_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar35 = auVar35 & auVar44;
      auVar32 = pshuflw(auVar40,auVar35,0xe8);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19 + 4] = 0x400;
      }
      auVar32 = packssdw(auVar35,auVar35);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19 + 5] = 0x400;
      }
      auVar32 = auVar28 ^ auVar14;
      iVar15 = auVar32._0_4_;
      iVar37 = auVar32._8_4_;
      auVar41._4_4_ = iVar15;
      auVar41._0_4_ = iVar15;
      auVar41._8_4_ = iVar37;
      auVar41._12_4_ = iVar37;
      auVar45._0_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar45._4_4_ = -(uint)(iVar15 < -0x7ffffefe);
      auVar45._8_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar45._12_4_ = -(uint)(iVar37 < -0x7ffffefe);
      auVar36._0_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar36._4_4_ = -(uint)(auVar32._4_4_ == -0x80000000);
      auVar36._8_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar36._12_4_ = -(uint)(auVar32._12_4_ == -0x80000000);
      auVar36 = auVar36 & auVar45;
      auVar32 = packssdw(auVar41,auVar36);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19 + 6] = 0x400;
      }
      auVar32 = pshufhw(auVar36,auVar36,0x84);
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        zip->bcj2_p[lVar19 + 7] = 0x400;
      }
      lVar19 = lVar19 + 8;
      lVar26 = auVar31._8_8_;
      auVar31._0_8_ = auVar31._0_8_ + 8;
      auVar31._8_8_ = lVar26 + 8;
      lVar26 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 8;
      auVar30._8_8_ = lVar26 + 8;
      lVar26 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 8;
      auVar29._8_8_ = lVar26 + 8;
      lVar26 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 8;
      auVar28._8_8_ = lVar26 + 8;
    } while (lVar19 != 0x108);
    zip->bcj2_range = 0xffffffff;
    zip->bcj2_code = 0;
    sVar20 = 0;
    do {
      if (sVar12 == sVar20) {
        return -0x19;
      }
      zip->bcj2_code = (uint)local_78[sVar20] | zip->bcj2_code << 8;
      sVar20 = sVar20 + 1;
    } while ((int)sVar20 != 5);
    zip->bcj_state = 1;
    local_78 = local_78 + sVar20;
  }
  uVar25 = 0;
  if (outSize != 0 && zip->odd_bcj_size != 0) {
    do {
      outBuf[uVar25] = zip->odd_bcj[uVar25 & 0xffffffff];
      uVar25 = uVar25 + 1;
      psVar1 = &zip->odd_bcj_size;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
    } while (uVar25 < outSize);
  }
  if (outSize != 0) {
    lVar19 = sVar8 - sVar24;
    local_60 = (uint *)(puVar9 + (sVar10 - local_50));
    local_68 = (uint *)(puVar11 + (sVar13 - local_58));
    local_38 = zip->bcj2_p;
    local_40 = zip->odd_bcj;
    lVar26 = 0;
    local_80 = sVar24;
    local_70 = outSize;
    do {
      uVar17 = outSize - uVar25;
      if (sVar24 - lVar26 <= outSize - uVar25) {
        uVar17 = sVar24 - lVar26;
      }
      if ((zip->bcj_state == 1) && (uVar18 = uVar25, uVar17 != 0)) {
        do {
          uVar25 = uVar18 + 1;
          bVar3 = puVar7[lVar26 + lVar19];
          outBuf[uVar18] = bVar3;
          if (((bVar3 & 0xfe) == 0xe8) ||
             (((bVar3 & 0xf0) == 0x80 && (zip->bcj2_prevByte == '\x0f')))) {
            zip->bcj_state = 2;
            bVar27 = false;
          }
          else {
            lVar26 = lVar26 + 1;
            zip->bcj2_prevByte = bVar3;
            uVar17 = uVar17 - 1;
            bVar27 = true;
          }
          if (!bVar27) goto LAB_00127a3b;
          uVar18 = uVar25;
        } while (uVar17 != 0);
        uVar17 = 0;
      }
LAB_00127a3b:
      iVar15 = 0xb;
      if ((uVar25 != outSize) && (uVar17 != 0)) {
        zip->bcj_state = 1;
        uVar4 = puVar7[lVar26 + lVar19];
        if (uVar4 == 0xe8) {
          puVar21 = local_38 + zip->bcj2_prevByte;
        }
        else {
          puVar21 = (uint16_t *)(zip->format_name + (ulong)(uVar4 != 0xe9) * 2 + -0x20);
        }
        lVar26 = lVar26 + 1;
        uVar5 = *puVar21;
        uVar6 = zip->bcj2_code;
        uVar23 = (zip->bcj2_range >> 0xb) * (uint)uVar5;
        outSize = local_70;
        sVar24 = local_80;
        if (uVar6 < uVar23) {
          zip->bcj2_range = uVar23;
          *puVar21 = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar23 < 0x1000000) {
            if (local_78 == local_48) {
              iVar15 = 1;
              goto LAB_00127cf6;
            }
            zip->bcj2_range = uVar23 * 0x100;
            bVar3 = *local_78;
            local_78 = local_78 + 1;
            zip->bcj2_code = (uint)bVar3 | uVar6 << 8;
          }
          zip->bcj2_prevByte = uVar4;
          iVar15 = 0;
        }
        else {
          uVar22 = zip->bcj2_range - uVar23;
          zip->bcj2_range = uVar22;
          zip->bcj2_code = uVar6 - uVar23;
          *puVar21 = uVar5 - (uVar5 >> 5);
          if (uVar22 < 0x1000000) {
            if (local_78 == local_48) {
              iVar15 = 1;
              goto LAB_00127cf6;
            }
            zip->bcj2_range = uVar22 * 0x100;
            bVar3 = *local_78;
            local_78 = local_78 + 1;
            zip->bcj2_code = (uint)bVar3 | (uVar6 - uVar23) * 0x100;
          }
          iVar15 = 1;
          if (uVar4 == 0xe8) {
            if (3 < local_50) {
              local_50 = local_50 - 4;
              puVar16 = local_60;
              local_60 = local_60 + 1;
LAB_00127be6:
              uVar6 = *puVar16;
              iVar15 = ((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                        uVar6 << 0x18) - ((int)zip->bcj2_outPos + (int)uVar25)) + -4;
              local_84[0] = (uint8_t)iVar15;
              local_84[1] = (uint8_t)((uint)iVar15 >> 8);
              local_84[2] = (uint8_t)((uint)iVar15 >> 0x10);
              local_84[3] = (uint8_t)((uint)iVar15 >> 0x18);
              zip->bcj2_prevByte = local_84[3];
              bVar27 = true;
              iVar15 = 0;
              if (uVar25 < local_70) {
                uVar17 = ~uVar25 + local_70;
                if (2 < uVar17) {
                  uVar17 = 3;
                }
                memcpy(outBuf + uVar25,local_84,uVar17 + 1);
                uVar18 = 0;
                do {
                  uVar17 = uVar18 + 1;
                  bVar27 = uVar18 < 3;
                  if (!bVar27) break;
                  lVar2 = uVar18 + uVar25;
                  uVar18 = uVar17;
                } while (lVar2 + 1U < local_70);
                uVar25 = uVar25 + uVar17;
              }
              else {
                uVar17 = 0;
              }
              outSize = local_70;
              sVar24 = local_80;
              if (bVar27) {
                uVar18 = (ulong)(4 - (uint)uVar17);
                zip->odd_bcj_size = uVar18;
                iVar15 = 0xb;
                if ((uint)uVar17 < 4) {
                  memcpy(local_40,local_84 + (uVar17 & 0xffffffff),uVar18);
                  outSize = local_70;
                  sVar24 = local_80;
                  iVar15 = 0xb;
                }
              }
            }
          }
          else if (3 < local_58) {
            local_58 = local_58 - 4;
            puVar16 = local_68;
            local_68 = local_68 + 1;
            goto LAB_00127be6;
          }
        }
      }
LAB_00127cf6:
    } while (iVar15 == 0);
    if (iVar15 != 0xb) {
      return -0x19;
    }
    zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_remaining - lVar26;
    zip->sub_stream_bytes_remaining[0] = local_50;
    zip->sub_stream_bytes_remaining[1] = local_58;
    zip->sub_stream_bytes_remaining[2] = (long)local_48 - (long)local_78;
  }
  zip->bcj2_outPos = zip->bcj2_outPos + uVar25;
  return uVar25;
}

Assistant:

static ssize_t
Bcj2_Decode(struct _7zip *zip, uint8_t *outBuf, size_t outSize)
{
	size_t inPos = 0, outPos = 0;
	const uint8_t *buf0, *buf1, *buf2, *buf3;
	size_t size0, size1, size2, size3;
	const uint8_t *buffer, *bufferLim;
	unsigned int i, j;

	size0 = zip->tmp_stream_bytes_remaining;
	buf0 = zip->tmp_stream_buff + zip->tmp_stream_bytes_avail - size0;
	size1 = zip->sub_stream_bytes_remaining[0];
	buf1 = zip->sub_stream_buff[0] + zip->sub_stream_size[0] - size1;
	size2 = zip->sub_stream_bytes_remaining[1];
	buf2 = zip->sub_stream_buff[1] + zip->sub_stream_size[1] - size2;
	size3 = zip->sub_stream_bytes_remaining[2];
	buf3 = zip->sub_stream_buff[2] + zip->sub_stream_size[2] - size3;

	buffer = buf3;
	bufferLim = buffer + size3;

	if (zip->bcj_state == 0) {
		/*
		 * Initialize.
		 */
		zip->bcj2_prevByte = 0;
		for (i = 0;
		    i < sizeof(zip->bcj2_p) / sizeof(zip->bcj2_p[0]); i++)
			zip->bcj2_p[i] = kBitModelTotal >> 1;
		RC_INIT2;
		zip->bcj_state = 1;
	}

	/*
	 * Gather the odd bytes of a previous call.
	 */
	for (i = 0; zip->odd_bcj_size > 0 && outPos < outSize; i++) {
		outBuf[outPos++] = zip->odd_bcj[i];
		zip->odd_bcj_size--;
	}

	if (outSize == 0) {
		zip->bcj2_outPos += outPos;
		return (outPos);
	}

	for (;;) {
		uint8_t b;
		CProb *prob;
		uint32_t bound;
		uint32_t ttt;

		size_t limit = size0 - inPos;
		if (outSize - outPos < limit)
			limit = outSize - outPos;

		if (zip->bcj_state == 1) {
			while (limit != 0) {
				uint8_t bb = buf0[inPos];
				outBuf[outPos++] = bb;
				if (IsJ(zip->bcj2_prevByte, bb)) {
					zip->bcj_state = 2;
					break;
				}
				inPos++;
				zip->bcj2_prevByte = bb;
				limit--;
			}
		}

		if (limit == 0 || outPos == outSize)
			break;
		zip->bcj_state = 1;

		b = buf0[inPos++];

		if (b == 0xE8)
			prob = zip->bcj2_p + zip->bcj2_prevByte;
		else if (b == 0xE9)
			prob = zip->bcj2_p + 256;
		else
			prob = zip->bcj2_p + 257;

		IF_BIT_0(prob) {
			UPDATE_0(prob)
			zip->bcj2_prevByte = b;
		} else {
			uint32_t dest;
			const uint8_t *v;
			uint8_t out[4];

			UPDATE_1(prob)
			if (b == 0xE8) {
				v = buf1;
				if (size1 < 4)
					return SZ_ERROR_DATA;
				buf1 += 4;
				size1 -= 4;
			} else {
				v = buf2;
				if (size2 < 4)
					return SZ_ERROR_DATA;
				buf2 += 4;
				size2 -= 4;
			}
			dest = (((uint32_t)v[0] << 24) |
			    ((uint32_t)v[1] << 16) |
			    ((uint32_t)v[2] << 8) |
			    ((uint32_t)v[3])) -
			    ((uint32_t)zip->bcj2_outPos + (uint32_t)outPos + 4);
			out[0] = (uint8_t)dest;
			out[1] = (uint8_t)(dest >> 8);
			out[2] = (uint8_t)(dest >> 16);
			out[3] = zip->bcj2_prevByte = (uint8_t)(dest >> 24);

			for (i = 0; i < 4 && outPos < outSize; i++)
				outBuf[outPos++] = out[i];
			if (i < 4) {
				/*
				 * Save odd bytes which we could not add into
				 * the output buffer because of out of space.
				 */
				zip->odd_bcj_size = 4 -i;
				for (; i < 4; i++) {
					j = i - 4 + (unsigned)zip->odd_bcj_size;
					zip->odd_bcj[j] = out[i];
				}
				break;
			}
		}
	}